

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadjointcheckpointscheme_fixed.c
# Opt level: O0

SUNErrCode
SUNAdjointCheckpointScheme_LoadVector_Fixed
          (SUNAdjointCheckpointScheme self,suncountertype step_num,suncountertype stage_num,int peek
          ,N_Vector *yout,sunrealtype *tout)

{
  char *__ptr;
  int in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 in_R9;
  char *key_1;
  int has_children;
  SUNDataNode solution_node;
  char *key;
  SUNDataNode step_data_node;
  SUNErrCode errcode;
  SUNContext sunctx_local_scope_;
  int64_t in_stack_ffffffffffffff90;
  int local_64;
  long local_60;
  char *local_58;
  long local_50;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  int local_24;
  undefined8 local_20;
  long local_18;
  long local_10;
  SUNErrCode local_4;
  
  local_40 = *(undefined8 *)(in_RDI + 0x10);
  local_44 = 0;
  local_50 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  if (in_RSI == *(long *)(*(long *)(in_RDI + 8) + 0x18)) {
    local_50 = *(long *)(*(long *)(in_RDI + 8) + 0x38);
  }
  else {
    local_18 = in_RSI;
    local_58 = sunSignedToString(in_stack_ffffffffffffff90);
    local_44 = SUNDataNode_GetNamedChild
                         (*(undefined8 *)(*(long *)(local_10 + 8) + 0x28),local_58,&local_50);
    free(local_58);
    if (local_44 == 0) {
      *(long *)(*(long *)(local_10 + 8) + 0x38) = local_50;
      *(long *)(*(long *)(local_10 + 8) + 0x18) = local_18;
    }
    else if (local_44 == -0x26ff) {
      local_50 = 0;
    }
  }
  if (local_50 == 0) {
    local_4 = -0x26f7;
  }
  else {
    local_60 = 0;
    if ((*(int *)(*(long *)(local_10 + 8) + 0x44) == 0) && (local_24 == 0)) {
      local_64 = 0;
      SUNDataNode_HasChildren(local_50,&local_64);
      if ((local_64 != 0) &&
         (local_44 = SUNDataNode_RemoveChild(local_50,local_20,&local_60), local_44 == -0x26ff)) {
        local_60 = 0;
      }
      SUNDataNode_HasChildren(local_50,&local_64);
      if (local_64 == 0) {
        __ptr = sunSignedToString(in_stack_ffffffffffffff90);
        SUNDataNode_RemoveNamedChild
                  (*(undefined8 *)(*(long *)(local_10 + 8) + 0x28),__ptr,&local_50);
        free(__ptr);
        SUNDataNode_Destroy(&local_50);
      }
    }
    else {
      local_44 = SUNDataNode_GetChild(local_50,local_20,&local_60);
      if (local_44 == -0x26ff) {
        local_60 = 0;
      }
    }
    if (local_60 == 0) {
      local_4 = -0x26f7;
    }
    else {
      SUNDataNode_GetDataNvector(local_60,*local_30,local_38);
      if ((*(int *)(*(long *)(local_10 + 8) + 0x44) == 0) && (local_24 == 0)) {
        SUNDataNode_Destroy(&local_60);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_LoadVector_Fixed(
  SUNAdjointCheckpointScheme self, suncountertype step_num,
  suncountertype stage_num, sunbooleantype peek, N_Vector* yout,
  sunrealtype* tout)
{
  SUNFunctionBegin(self->sunctx);

  SUNErrCode errcode = SUN_SUCCESS;

  /* If we are trying to load the step solution, we need to load the list which holds
     the step and stage solutions. We keep a pointer to the list node until
     this step is over for fast access when loading stages. */
  SUNDataNode step_data_node = NULL;
  if (step_num != IMPL_MEMBER(self, step_num_of_current_load))
  {
    char* key = sunSignedToString(step_num);
    SUNLogExtraDebug(SUNCTX_->logger, "try-load-new-step",
                     "step_num = %d, stage_num = %d", step_num, stage_num);
    errcode = SUNDataNode_GetNamedChild(IMPL_MEMBER(self, root_node), key,
                                        &step_data_node);
    free(key);
    if (errcode == SUN_SUCCESS)
    {
      IMPL_MEMBER(self, current_load_step_node)   = step_data_node;
      IMPL_MEMBER(self, step_num_of_current_load) = step_num;
    }
    else if (errcode == SUN_ERR_DATANODE_NODENOTFOUND)
    {
      step_data_node = NULL;
    }
    else { SUNCheckCall(errcode); }
  }
  else { step_data_node = IMPL_MEMBER(self, current_load_step_node); }

  if (!step_data_node)
  {
    SUNLogExtraDebug(SUNCTX_->logger, "step-not-found",
                     "step_num = %d, stage_num = %d", step_num, stage_num);
    return SUN_ERR_CHECKPOINT_NOT_FOUND;
  }

  SUNLogExtraDebug(SUNCTX_->logger, "step-loaded",
                   "step_num = %d, stage_num = %d", step_num, stage_num);

  SUNDataNode solution_node = NULL;
  if (IMPL_MEMBER(self, keep) || peek)
  {
    SUNLogExtraDebug(SUNCTX_->logger, "try-load-stage",
                     "keep = 1, step_num = %d, stage_num = %d", step_num,
                     stage_num);
    errcode = SUNDataNode_GetChild(step_data_node, stage_num, &solution_node);
    if (errcode == SUN_ERR_DATANODE_NODENOTFOUND) { solution_node = NULL; }
    else { SUNCheckCall(errcode); }
  }
  else
  {
    sunbooleantype has_children = SUNFALSE;
    SUNCheckCall(SUNDataNode_HasChildren(step_data_node, &has_children));

    if (has_children)
    {
      SUNLogExtraDebug(SUNCTX_->logger, "try-load-stage",
                       "keep = 0, step_num = %d, stage_num = %d", step_num,
                       stage_num);
      errcode = SUNDataNode_RemoveChild(step_data_node, stage_num,
                                        &solution_node);
      if (errcode == SUN_ERR_DATANODE_NODENOTFOUND) { solution_node = NULL; }
      else { SUNCheckCall(errcode); }
    }

    /* If we just removed the last stage (so has_children==false),
       then we should remove the step too. */
    SUNCheckCall(SUNDataNode_HasChildren(step_data_node, &has_children));
    if (!has_children)
    {
      char* key = sunSignedToString(step_num);
      SUNLogExtraDebug(SUNCTX_->logger, "remove-step", "step_num = %d", step_num);
      SUNCheckCall(SUNDataNode_RemoveNamedChild(IMPL_MEMBER(self, root_node),
                                                key, &step_data_node));
      free(key);
      SUNCheckCall(SUNDataNode_Destroy(&step_data_node));
    }
  }

  if (!solution_node)
  {
    SUNLogExtraDebug(SUNCTX_->logger, "stage-not-found",
                     "step_num = %d, stage_num = %d", step_num, stage_num);
    return SUN_ERR_CHECKPOINT_NOT_FOUND;
  }

  SUNCheckCall(SUNDataNode_GetDataNvector(solution_node, *yout, tout));
  SUNLogExtraDebug(SUNCTX_->logger, "stage-loaded",
                   "step_num = %d, stage_num = %d, t = %g", step_num, stage_num,
                   *tout);

  /* Cleanup the checkpoint memory if need be */
  if (!(IMPL_MEMBER(self, keep) || peek))
  {
    SUNCheckCall(SUNDataNode_Destroy(&solution_node));
  }

  return SUN_SUCCESS;
}